

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

int Option::parseCommandLine(QStringList *args,QMakeCmdLineParserState *state)

{
  QString *pQVar1;
  FILE *pFVar2;
  Data *pDVar3;
  qsizetype qVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  ArgumentReturn AVar8;
  long lVar9;
  iterator iVar10;
  iterator iVar11;
  char *pcVar12;
  char *pcVar13;
  char16_t *pcVar14;
  QStringList *this;
  uint uVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_d0;
  QArrayDataPointer<char> local_b8;
  QFileInfo fi;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  int x;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  x = 0;
  uVar15 = 1;
LAB_0020cc15:
  bVar6 = false;
  do {
    lVar9 = (long)x;
    if ((args->d).size <= lVar9) {
      uVar15 = 0;
      if (!bVar6) goto LAB_0020d2cc;
LAB_0020d306:
      pFVar2 = _stderr;
      QString::toLocal8Bit((QByteArray *)&local_58,(args->d).ptr + lVar9 + -1);
      pcVar14 = local_58.ptr;
      if (local_58.ptr == (char16_t *)0x0) {
        pcVar14 = (char16_t *)&QByteArray::_empty;
      }
      fprintf(pFVar2,"***Option %s requires a parameter\n",pcVar14);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      uVar15 = 5;
      goto LAB_0020d2cc;
    }
    if (bVar6) {
      x = x + -1;
      QFile::setFileName((QString *)output);
      iVar10 = QList<QString>::begin(args);
      lVar9 = (long)x;
      iVar11 = QList<QString>::begin(args);
      QList<QString>::erase(args,iVar10.i + lVar9,iVar11.i + (long)x + 2);
      goto LAB_0020cc15;
    }
    AVar8 = QMakeGlobals::addCommandLineArguments(globals,state,args,&x);
    if (AVar8 == ArgumentMalformed) {
      lVar9 = (long)x;
      goto LAB_0020d306;
    }
    if ((globals->qtconf).d.size != 0) {
      QLibraryInfoPrivate::setQtconfManualPath((QString *)&globals->qtconf);
    }
    bVar6 = false;
    if (AVar8 != ArgumentsOk) {
      lVar9 = (long)x;
      pQVar1 = (args->d).ptr;
      local_58.d = pQVar1[lVar9].d.d;
      local_58.ptr = pQVar1[lVar9].d.ptr;
      local_58.size = pQVar1[lVar9].d.size;
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      cVar5 = QString::startsWith((QChar)(char16_t)&local_58,0x2d);
      if (cVar5 == '\0') {
        if (qmake_mode - QMAKE_SET_PROPERTY < 3) {
          QList<QString>::emplaceBack<QString_const&>(&prop::properties,(QString *)&local_58);
        }
        else {
          _fi = 0xaaaaaaaaaaaaaaaa;
          QFileInfo::QFileInfo(&fi,(QString *)&local_58);
          cVar5 = QFileInfo::makeAbsolute();
          if (cVar5 == '\0') {
            QFileInfo::filePath();
            qVar4 = local_58.size;
            pcVar14 = local_58.ptr;
            pDVar3 = local_58.d;
            local_58.d = local_78.d;
            local_58.ptr = local_78.ptr;
            local_78.d = pDVar3;
            local_78.ptr = pcVar14;
            local_58.size = local_78.size;
            local_78.size = qVar4;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          }
          if ((qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
            cVar5 = QFileInfo::isDir();
            if (cVar5 == '\0') {
              this = &mkfile::project_files;
LAB_0020d148:
              QList<QString>::emplaceBack<QString_const&>(this,(QString *)&local_58);
              bVar7 = false;
            }
            else {
              local_78.size = 0;
              local_78.d = (Data *)0x0;
              local_78.ptr = (char16_t *)0x0;
              local_98.size = -0x5555555555555556;
              local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_98.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              detectProjectFile((QString *)&local_98,(QString *)&local_58,(QString *)&local_78);
              pFVar2 = _stderr;
              bVar7 = local_98.ptr == (char16_t *)0x0;
              if (bVar7) {
                QString::toUtf8_helper((QString *)&local_b8);
                pcVar12 = local_b8.ptr;
                if (local_b8.ptr == (char *)0x0) {
                  pcVar12 = (char *)&QByteArray::_empty;
                }
                QString::toUtf8_helper((QString *)&local_d0);
                pcVar13 = local_d0.ptr;
                if (local_d0.ptr == (char *)0x0) {
                  pcVar13 = (char *)&QByteArray::_empty;
                }
                fprintf(pFVar2,
                        "***Cannot detect .pro file in directory \'%s\'.\n\nQMake expects the file \'%s\' or exactly one .pro file in the given directory.\n"
                        ,pcVar12,pcVar13);
                QArrayDataPointer<char>::~QArrayDataPointer(&local_d0);
                QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
              }
              else {
                QList<QString>::emplaceBack<QString_const&>
                          (&mkfile::project_files,(QString *)&local_98);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            }
            bVar6 = false;
          }
          else {
            if (qmake_mode == QMAKE_GENERATE_PROJECT) {
              this = &projfile::project_dirs;
              goto LAB_0020d148;
            }
            bVar6 = true;
            bVar7 = false;
          }
          QFileInfo::~QFileInfo(&fi);
          if ((bVar7 != false) || (bVar6)) {
            uVar15 = bVar7 ^ 5;
            goto LAB_0020d2bf;
          }
        }
        goto LAB_0020d177;
      }
      bVar6 = comparesEqual((QString *)&local_58,"-d");
      if (bVar6) {
        debug_level = debug_level + 1;
        goto LAB_0020ce28;
      }
      bVar6 = comparesEqual((QString *)&local_58,"-v");
      if (((bVar6) || (bVar6 = comparesEqual((QString *)&local_58,"-version"), bVar6)) ||
         (bVar6 = comparesEqual((QString *)&local_58,"--version"), bVar6)) {
        pFVar2 = _stdout;
        QMakeLibraryInfo::path((QString *)&local_98,3);
        QString::toLatin1_helper_inplace((QString *)&local_78);
        pcVar14 = local_78.ptr;
        if (local_78.ptr == (char16_t *)0x0) {
          pcVar14 = (char16_t *)&QByteArray::_empty;
        }
        fprintf(pFVar2,"QMake version %s\nUsing Qt version %s in %s\n","3.1","6.10.0",pcVar14);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        uVar15 = 2;
      }
      else {
        bVar6 = comparesEqual((QString *)&local_58,"-h");
        if (((!bVar6) && (bVar6 = comparesEqual((QString *)&local_58,"-help"), !bVar6)) &&
           (bVar6 = comparesEqual((QString *)&local_58,"--help"), !bVar6)) {
          bVar6 = comparesEqual((QString *)&local_58,"-Wall");
          if (bVar6) {
            warn_level = CONCAT31(warn_level._1_3_,0xff);
LAB_0020ce28:
            bVar6 = false;
          }
          else {
            bVar6 = comparesEqual((QString *)&local_58,"-Wparser");
            if (bVar6) {
              warn_level = warn_level | 1;
              goto LAB_0020ce28;
            }
            bVar6 = comparesEqual((QString *)&local_58,"-Wlogic");
            if (bVar6) {
              warn_level = warn_level | 2;
              goto LAB_0020ce28;
            }
            bVar6 = comparesEqual((QString *)&local_58,"-Wdeprecated");
            if (bVar6) {
              warn_level = warn_level | 4;
              goto LAB_0020ce28;
            }
            bVar6 = comparesEqual((QString *)&local_58,"-Wnone");
            if (bVar6) {
              warn_level = 0;
              goto LAB_0020ce28;
            }
            bVar6 = comparesEqual((QString *)&local_58,"-r");
            if ((bVar6) || (bVar6 = comparesEqual((QString *)&local_58,"-recursive"), bVar6)) {
              recursive = true;
              goto LAB_0020d177;
            }
            bVar6 = comparesEqual((QString *)&local_58,"-nr");
            if ((bVar6) || (bVar6 = comparesEqual((QString *)&local_58,"-norecursive"), bVar6))
            break;
            bVar7 = comparesEqual((QString *)&local_58,"-o");
            bVar6 = true;
            if (!bVar7) {
              bVar7 = comparesEqual((QString *)&local_58,"-output");
              bVar6 = true;
              if (!bVar7) {
                if ((qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
                  bVar6 = comparesEqual((QString *)&local_58,"-nodepend");
                  if ((bVar6) || (bVar6 = comparesEqual((QString *)&local_58,"-nodepends"), bVar6))
                  {
                    mkfile::do_deps = false;
                  }
                  else {
                    bVar6 = comparesEqual((QString *)&local_58,"-nomoc");
                    if (bVar6) {
                      mkfile::do_mocs = false;
                    }
                    else {
                      bVar6 = comparesEqual((QString *)&local_58,"-nodependheuristics");
                      if (bVar6) {
                        mkfile::do_dep_heuristics = false;
                      }
                      else {
                        bVar6 = comparesEqual((QString *)&local_58,"-E");
                        if (!bVar6) goto LAB_0020d35d;
                        mkfile::do_preprocess = true;
                      }
                    }
                  }
                  goto LAB_0020ce28;
                }
                bVar6 = false;
                if (qmake_mode == QMAKE_GENERATE_PROJECT) {
                  bVar6 = comparesEqual((QString *)&local_58,"-nopwd");
                  if (!bVar6) {
LAB_0020d35d:
                    pFVar2 = _stderr;
                    QString::toLatin1_helper((QString *)&local_78);
                    pcVar14 = local_78.ptr;
                    if (local_78.ptr == (char16_t *)0x0) {
                      pcVar14 = (char16_t *)&QByteArray::_empty;
                    }
                    fprintf(pFVar2,"***Unknown option %s\n",pcVar14);
                    QArrayDataPointer<char>::~QArrayDataPointer
                              ((QArrayDataPointer<char> *)&local_78);
                    uVar15 = 5;
                    goto LAB_0020d2bf;
                  }
                  projfile::do_pwd = false;
                  bVar6 = false;
                }
              }
            }
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          goto LAB_0020ce32;
        }
      }
LAB_0020d2bf:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_0020d2cc:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return uVar15;
    }
LAB_0020ce32:
    x = x + 1;
  } while( true );
  recursive = false;
LAB_0020d177:
  QList<QString>::removeAt(args,(long)x);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  goto LAB_0020cc15;
}

Assistant:

int
Option::parseCommandLine(QStringList &args, QMakeCmdLineParserState &state)
{
    enum { ArgNone, ArgOutput } argState = ArgNone;
    int x = 0;
    while (x < args.size()) {
        switch (argState) {
        case ArgOutput:
            Option::output.setFileName(args.at(x--));
            args.erase(args.begin() + x, args.begin() + x + 2);
            argState = ArgNone;
            continue;
        default:
            QMakeGlobals::ArgumentReturn cmdRet = globals->addCommandLineArguments(state, args, &x);
            if (cmdRet == QMakeGlobals::ArgumentMalformed) {
                fprintf(stderr, "***Option %s requires a parameter\n", qPrintable(args.at(x - 1)));
                return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
            }
            if (!globals->qtconf.isEmpty())
                QLibraryInfoPrivate::setQtconfManualPath(&globals->qtconf);
            if (cmdRet == QMakeGlobals::ArgumentsOk)
                break;
            Q_ASSERT(cmdRet == QMakeGlobals::ArgumentUnknown);
            QString arg = args.at(x);
            if (arg.startsWith(QLatin1Char('-'))) {
                if (arg == "-d") {
                    Option::debug_level++;
                } else if (arg == "-v" || arg == "-version" || arg == "--version") {
                    fprintf(stdout,
                            "QMake version %s\n"
                            "Using Qt version %s in %s\n",
                            QMAKE_VERSION_STR, QT_VERSION_STR,
                            QMakeLibraryInfo::path(QLibraryInfo::LibrariesPath)
                                    .toLatin1()
                                    .constData());
#ifdef QMAKE_OPENSOURCE_VERSION
                    fprintf(stdout, "QMake is Open Source software from The Qt Company Ltd and/or its subsidiary(-ies).\n");
#endif
                    return Option::QMAKE_CMDLINE_BAIL;
                } else if (arg == "-h" || arg == "-help" || arg == "--help") {
                    return Option::QMAKE_CMDLINE_SHOW_USAGE;
                } else if (arg == "-Wall") {
                    Option::warn_level |= WarnAll;
                } else if (arg == "-Wparser") {
                    Option::warn_level |= WarnParser;
                } else if (arg == "-Wlogic") {
                    Option::warn_level |= WarnLogic;
                } else if (arg == "-Wdeprecated") {
                    Option::warn_level |= WarnDeprecated;
                } else if (arg == "-Wnone") {
                    Option::warn_level = WarnNone;
                } else if (arg == "-r" || arg == "-recursive") {
                    Option::recursive = true;
                    args.removeAt(x);
                    continue;
                } else if (arg == "-nr" || arg == "-norecursive") {
                    Option::recursive = false;
                    args.removeAt(x);
                    continue;
                } else if (arg == "-o" || arg == "-output") {
                    argState = ArgOutput;
                } else {
                    if (Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                        Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                        if (arg == "-nodepend" || arg == "-nodepends") {
                            Option::mkfile::do_deps = false;
                        } else if (arg == "-nomoc") {
                            Option::mkfile::do_mocs = false;
                        } else if (arg == "-nodependheuristics") {
                            Option::mkfile::do_dep_heuristics = false;
                        } else if (arg == "-E") {
                            Option::mkfile::do_preprocess = true;
                        } else {
                            fprintf(stderr, "***Unknown option %s\n", arg.toLatin1().constData());
                            return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                        }
                    } else if (Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT) {
                        if (arg == "-nopwd") {
                            Option::projfile::do_pwd = false;
                        } else {
                            fprintf(stderr, "***Unknown option %s\n", arg.toLatin1().constData());
                            return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                        }
                    }
                }
            } else {
                bool handled = true;
                if(Option::qmake_mode == Option::QMAKE_QUERY_PROPERTY ||
                    Option::qmake_mode == Option::QMAKE_SET_PROPERTY ||
                    Option::qmake_mode == Option::QMAKE_UNSET_PROPERTY) {
                    Option::prop::properties.append(arg);
                } else {
                    QFileInfo fi(arg);
                    if(!fi.makeAbsolute()) //strange
                        arg = fi.filePath();
                    if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                       Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                        if(fi.isDir()) {
                            QString singleProFileCandidate;
                            QString proj = detectProjectFile(arg, &singleProFileCandidate);
                            if (proj.isNull()) {
                                fprintf(stderr, "***Cannot detect .pro file in directory '%s'.\n\n"
                                        "QMake expects the file '%s' "
                                        "or exactly one .pro file in the given directory.\n",
                                        qUtf8Printable(arg),
                                        qUtf8Printable(singleProFileCandidate));
                                return Option::QMAKE_CMDLINE_ERROR;
                            }
                            Option::mkfile::project_files.append(proj);
                        } else {
                            Option::mkfile::project_files.append(arg);
                        }
                    } else if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT) {
                        Option::projfile::project_dirs.append(arg);
                    } else {
                        handled = false;
                    }
                }
                if(!handled) {
                    return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                }
                args.removeAt(x);
                continue;
            }
        }
        x++;
    }
    if (argState != ArgNone) {
        fprintf(stderr, "***Option %s requires a parameter\n", qPrintable(args.at(x - 1)));
        return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
    }
    return Option::QMAKE_CMDLINE_SUCCESS;
}